

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O2

double __thiscall QDoubleSpinBox::valueFromText(QDoubleSpinBox *this,QString *text)

{
  QDoubleSpinBoxPrivate *this_00;
  long in_FS_OFFSET;
  double dVar1;
  State state;
  int pos;
  State local_60;
  int local_5c;
  QArrayDataPointer<char16_t> local_58;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDoubleSpinBoxPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  local_58.d = (text->d).d;
  local_58.ptr = (text->d).ptr;
  local_58.size = (text->d).size;
  if (local_58.d != (Data *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_5c = QLineEdit::cursorPosition((this_00->super_QAbstractSpinBoxPrivate).edit);
  local_60 = Acceptable;
  QDoubleSpinBoxPrivate::validateAndInterpret
            (&local_40,this_00,(QString *)&local_58,&local_5c,&local_60);
  dVar1 = (double)::QVariant::toDouble((bool *)&local_40);
  ::QVariant::~QVariant(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return dVar1;
  }
  __stack_chk_fail();
}

Assistant:

double QDoubleSpinBox::valueFromText(const QString &text) const
{
    Q_D(const QDoubleSpinBox);

    QString copy = text;
    int pos = d->edit->cursorPosition();
    QValidator::State state = QValidator::Acceptable;
    return d->validateAndInterpret(copy, pos, state).toDouble();
}